

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int add_shape_property(JSContext *ctx,JSShape **psh,JSObject *p,JSAtom atom,int prop_flags)

{
  JSRuntime *pJVar1;
  JSShape *pJVar2;
  JSShape **ppJVar3;
  JSAtomStruct *pJVar4;
  uint8_t uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  JSShape **ppJVar9;
  JSShape *pJVar10;
  uint uVar11;
  
  pJVar1 = ctx->rt;
  pJVar10 = *psh;
  uVar5 = pJVar10->is_hashed;
  if (uVar5 == '\0') {
    uVar11 = 0;
  }
  else {
    uVar11 = pJVar10->hash;
    ppJVar3 = pJVar1->shape_hash + (uVar11 >> (-(char)pJVar1->shape_hash_bits & 0x1fU));
    do {
      ppJVar9 = ppJVar3;
      pJVar2 = *ppJVar9;
      ppJVar3 = &pJVar2->shape_hash_next;
    } while (pJVar2 != pJVar10);
    *ppJVar9 = pJVar10->shape_hash_next;
    pJVar1->shape_hash_count = pJVar1->shape_hash_count + -1;
    uVar11 = ((uVar11 + atom) * -0x61c8ffff + prop_flags) * -0x61c8ffff;
  }
  if (pJVar10->prop_size <= pJVar10->prop_count) {
    iVar6 = resize_properties(ctx,psh,p,pJVar10->prop_count + 1);
    if (iVar6 != 0) {
      if (pJVar10->is_hashed == '\0') {
        return -1;
      }
      uVar11 = pJVar10->hash >> (-(char)pJVar1->shape_hash_bits & 0x1fU);
      ppJVar3 = pJVar1->shape_hash;
      pJVar10->shape_hash_next = ppJVar3[uVar11];
      ppJVar3[uVar11] = pJVar10;
      pJVar1->shape_hash_count = pJVar1->shape_hash_count + 1;
      return -1;
    }
    pJVar10 = *psh;
    uVar5 = pJVar10->is_hashed;
  }
  if (uVar5 != '\0') {
    pJVar10->hash = uVar11;
    uVar11 = uVar11 >> (-(char)pJVar1->shape_hash_bits & 0x1fU);
    ppJVar3 = pJVar1->shape_hash;
    pJVar10->shape_hash_next = ppJVar3[uVar11];
    ppJVar3[uVar11] = pJVar10;
    pJVar1->shape_hash_count = pJVar1->shape_hash_count + 1;
  }
  lVar7 = (long)pJVar10->prop_count;
  pJVar10->prop_count = pJVar10->prop_count + 1;
  if (0xd1 < (int)atom) {
    pJVar4 = ctx->rt->atom_array[atom];
    (pJVar4->header).ref_count = (pJVar4->header).ref_count + 1;
  }
  *(JSAtom *)(&pJVar10[1].header.field_0x4 + lVar7 * 8) = atom;
  (&pJVar10[1].header.ref_count)[lVar7 * 2] =
       (&pJVar10[1].header.ref_count)[lVar7 * 2] & 0x3ffffffU | prop_flags << 0x1a;
  pJVar10->has_small_array_index = pJVar10->has_small_array_index | (byte)(atom >> 0x1f);
  uVar8 = ~(ulong)(atom & pJVar10->prop_hash_mask);
  (&pJVar10[1].header.ref_count)[lVar7 * 2] =
       (&pJVar10[1].header.ref_count)[lVar7 * 2] & 0xfc000000U |
       (&(pJVar10->header).ref_count)[uVar8] & 0x3ffffffU;
  (&(pJVar10->header).ref_count)[uVar8] = pJVar10->prop_count;
  return 0;
}

Assistant:

static int add_shape_property(JSContext *ctx, JSShape **psh,
                              JSObject *p, JSAtom atom, int prop_flags)
{
    JSRuntime *rt = ctx->rt;
    JSShape *sh = *psh;
    JSShapeProperty *pr, *prop;
    uint32_t hash_mask, new_shape_hash = 0;
    intptr_t h;

    /* update the shape hash */
    if (sh->is_hashed) {
        js_shape_hash_unlink(rt, sh);
        new_shape_hash = shape_hash(shape_hash(sh->hash, atom), prop_flags);
    }

    if (unlikely(sh->prop_count >= sh->prop_size)) {
        if (resize_properties(ctx, psh, p, sh->prop_count + 1)) {
            /* in case of error, reinsert in the hash table.
               sh is still valid if resize_properties() failed */
            if (sh->is_hashed)
                js_shape_hash_link(rt, sh);
            return -1;
        }
        sh = *psh;
    }
    if (sh->is_hashed) {
        sh->hash = new_shape_hash;
        js_shape_hash_link(rt, sh);
    }
    /* Initialize the new shape property.
       The object property at p->prop[sh->prop_count] is uninitialized */
    prop = get_shape_prop(sh);
    pr = &prop[sh->prop_count++];
    pr->atom = JS_DupAtom(ctx, atom);
    pr->flags = prop_flags;
    sh->has_small_array_index |= __JS_AtomIsTaggedInt(atom);
    /* add in hash table */
    hash_mask = sh->prop_hash_mask;
    h = atom & hash_mask;
    pr->hash_next = prop_hash_end(sh)[-h - 1];
    prop_hash_end(sh)[-h - 1] = sh->prop_count;
    return 0;
}